

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O0

size_t __thiscall
adios2::burstbuffer::FileDrainer::Write
          (FileDrainer *this,OutputFile *f,size_t count,char *buffer,string *path)

{
  element_type *peVar1;
  ulong uVar2;
  long in_RCX;
  size_t in_RDX;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_f0 [32];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  undefined1 local_49 [41];
  long local_20;
  size_t local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar1 = std::
           __shared_ptr_access<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xad086c);
  std::ostream::write((char *)peVar1,local_20);
  std::
  __shared_ptr_access<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0xad0891);
  uVar2 = std::ios::bad();
  if ((uVar2 & 1) != 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_49 + 1),"Toolkit",(allocator *)__lhs);
    __rhs = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"BurstBuffer::FileDrainer",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Write",&local_a9);
    std::operator+((char *)in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffed8);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  return local_18;
}

Assistant:

size_t FileDrainer::Write(OutputFile &f, size_t count, const char *buffer, const std::string &path)
{
    f->write(buffer, static_cast<std::streamsize>(count));

    if (f->bad())
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "BurstBuffer::FileDrainer", "Write",
                                              "FileDrainer couldn't write to file " + path +
                                                  " count = " + std::to_string(count) + " bytes");
    }

    return count;
}